

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O1

Object * __thiscall
ObjTable<QPDFWriter::Object>::element(ObjTable<QPDFWriter::Object> *this,size_t idx)

{
  pointer pOVar1;
  Object *pOVar2;
  runtime_error *this_00;
  ulong local_18;
  
  local_18 = idx;
  if (element(unsigned_long)::max_size == '\0') {
    element();
  }
  pOVar1 = (this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
           super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_18 <
      (ulong)(((long)(this->super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>).
                     super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 2) *
             -0x5555555555555555)) {
    pOVar2 = pOVar1 + local_18;
  }
  else {
    if (element::max_size <= local_18) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"Impossibly large object id encountered accessing ObjTable");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pOVar2 = std::
             map<unsigned_long,_QPDFWriter::Object,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::Object>_>_>
             ::at(&this->sparse_elements,&local_18);
  }
  return pOVar2;
}

Assistant:

inline T const&
    element(size_t idx) const
    {
        static const size_t max_size = std::vector<T>::max_size();
        if (idx < std::vector<T>::size()) {
            return std::vector<T>::operator[](idx);
        }
        if (idx < max_size) {
            return sparse_elements.at(idx);
        }
        throw std::runtime_error("Impossibly large object id encountered accessing ObjTable");
        return element(0); // doesn't return
    }